

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sha512.cpp
# Opt level: O2

string * hmac_hash::sha512(string *__return_storage_ptr__,string *input)

{
  long lVar1;
  size_t i;
  byte *__s;
  uint8_t digest [64];
  char buf [129];
  SHA512 ctx;
  byte local_248 [192];
  undefined1 local_188 [16];
  SHA512 local_178;
  
  for (lVar1 = 0; lVar1 != 0x40; lVar1 = lVar1 + 1) {
    local_248[lVar1] = 0;
  }
  local_178.m_h[0] = 0x6a09e667f3bcc908;
  local_178.m_h[1] = 0xbb67ae8584caa73b;
  local_178.m_h[2] = 0x3c6ef372fe94f82b;
  local_178.m_h[3] = 0xa54ff53a5f1d36f1;
  local_178.m_h[4] = 0x510e527fade682d1;
  local_178.m_h[5] = 0x9b05688c2b3e6c1f;
  local_178.m_h[6] = 0x1f83d9abfb41bd6b;
  local_178.m_h[7] = 0x5be0cd19137e2179;
  local_178.m_tot_len = 0;
  local_178.m_len = 0;
  SHA512::update(&local_178,(uint8_t *)(input->_M_dataplus)._M_p,input->_M_string_length);
  SHA512::finish(&local_178,local_248);
  __s = local_248 + 0x40;
  memset(__s,0,0x81);
  for (lVar1 = 0; lVar1 != 0x40; lVar1 = lVar1 + 1) {
    sprintf((char *)__s,"%02x",(ulong)local_248[lVar1]);
    __s = __s + 2;
  }
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)__return_storage_ptr__,local_248 + 0x40,local_188);
  return __return_storage_ptr__;
}

Assistant:

std::string sha512(const std::string &input) {
        uint8_t digest[hmac_hash::SHA512::DIGEST_SIZE];
        std::fill(digest, digest + hmac_hash::SHA512::DIGEST_SIZE, '\0');
        hmac_hash::SHA512 ctx;
        ctx.init();
        ctx.update((uint8_t*)input.c_str(), input.length());
        ctx.finish(digest);

        char buf[2 * hmac_hash::SHA512::DIGEST_SIZE + 1];
        std::fill(buf, buf + (2 * hmac_hash::SHA512::DIGEST_SIZE + 1), '\0');
        for(size_t i = 0; i < hmac_hash::SHA512::DIGEST_SIZE; ++i){
            sprintf(buf + i * 2, "%02x", digest[i]);
        }
        return std::string(buf, (2 * hmac_hash::SHA512::DIGEST_SIZE));
    }